

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_integer_sequence.cpp
# Opt level: O1

void encode_ise(quant_method quant_level,uint character_count,uint8_t *input_data,
               uint8_t *output_data,uint bit_offset)

{
  btq_count bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  
  uVar6 = (ulong)bit_offset;
  if (character_count == 0) {
    __assert_fail("character_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_integer_sequence.cpp"
                  ,500,
                  "void encode_ise(quant_method, unsigned int, const uint8_t *, uint8_t *, unsigned int)"
                 );
  }
  bVar1 = btq_counts._M_elems[quant_level];
  uVar7 = (byte)bVar1 & 0x3f;
  bVar3 = (byte)uVar7;
  uVar18 = ~(-1 << (bVar3 & 0x1f));
  if (((byte)bVar1 & 0x40) == 0) {
    if ((char)bVar1 < '\0') {
      uVar11 = 0;
      if (2 < character_count) {
        uVar14 = character_count / 3;
        uVar5 = ~(-8 << (bVar3 & 0x1f));
        uVar17 = ~(-4 << (bVar3 & 0x1f));
        uVar11 = 0;
        do {
          bVar2 = integer_of_quints[input_data[uVar11 + 2] >> (bVar3 & 0x1f)]
                  [input_data[uVar11 + 1] >> (bVar3 & 0x1f)][input_data[uVar11] >> (bVar3 & 0x1f)];
          iVar13 = (int)uVar6;
          bVar4 = (byte)uVar6 & 7;
          iVar10 = (((bVar2 & 7) << (bVar3 & 0x1f) & 0xff | input_data[uVar11] & uVar18) & uVar5) <<
                   bVar4;
          uVar6 = uVar6 >> 3;
          uVar19 = ~(uVar5 << bVar4);
          output_data[uVar6] = (byte)iVar10 | output_data[uVar6] & (byte)uVar19;
          output_data[uVar6 + 1] =
               (byte)((uint)iVar10 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
          uVar19 = uVar7 + 3 + iVar13;
          bVar4 = (byte)uVar19 & 7;
          iVar10 = (((bVar2 >> 3 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar11 + 1] & uVar18) &
                   uVar17) << bVar4;
          uVar6 = (ulong)(uVar19 >> 3);
          uVar19 = ~(uVar17 << bVar4);
          output_data[uVar6] = (byte)iVar10 | output_data[uVar6] & (byte)uVar19;
          output_data[uVar6 + 1] =
               (byte)((uint)iVar10 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
          uVar19 = uVar7 * 2 + 5 + iVar13;
          bVar4 = (byte)uVar19 & 7;
          iVar10 = (((bVar2 >> 5 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar11 + 2] & uVar18) &
                   uVar17) << bVar4;
          uVar6 = (ulong)(uVar19 >> 3);
          uVar19 = ~(uVar17 << bVar4);
          output_data[uVar6] = (byte)iVar10 | output_data[uVar6] & (byte)uVar19;
          output_data[uVar6 + 1] =
               (byte)((uint)iVar10 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
          uVar11 = uVar11 + 3;
          uVar6 = (ulong)(iVar13 + uVar7 * 3 + 7);
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      uVar17 = (uint)uVar11;
      if (character_count != uVar17) {
        if (uVar17 + 1 < character_count) {
          uVar12 = (ulong)(input_data[uVar17 + 1] >> (bVar3 & 0x1f));
        }
        else {
          uVar12 = 0;
        }
        if (uVar17 < character_count) {
          bVar2 = integer_of_quints[0][uVar12][input_data[uVar11 & 0xffffffff] >> (bVar3 & 0x1f)];
          lVar16 = 0;
          do {
            iVar13 = "\x03\x02"[lVar16] + uVar7;
            uVar5 = ~(-1 << ((byte)iVar13 & 0x1f));
            bVar4 = (byte)uVar6 & 7;
            iVar10 = (((~(-1 << ("\x03\x02"[lVar16] & 0x1f)) & (uint)(bVar2 >> (""[lVar16] & 0x1f)))
                       << (bVar3 & 0x1f) & 0xff |
                      input_data[lVar16 + (uVar11 & 0xffffffff)] & uVar18) & uVar5) << bVar4;
            uVar12 = uVar6 >> 3;
            uVar5 = ~(uVar5 << bVar4);
            output_data[uVar12] = (byte)iVar10 | output_data[uVar12] & (byte)uVar5;
            output_data[uVar12 + 1] =
                 (byte)((uint)iVar10 >> 8) | (byte)(uVar5 >> 8) & output_data[uVar12 + 1];
            uVar6 = (ulong)(uint)((int)uVar6 + iVar13);
            lVar16 = lVar16 + 1;
          } while (character_count - uVar17 != (int)lVar16);
        }
      }
    }
    else {
      uVar11 = 0;
      do {
        bVar3 = (byte)uVar6 & 7;
        iVar13 = (input_data[uVar11] & uVar18) << bVar3;
        uVar12 = uVar6 >> 3;
        uVar17 = ~(uVar18 << bVar3);
        output_data[uVar12] = (byte)iVar13 | output_data[uVar12] & (byte)uVar17;
        output_data[uVar12 + 1] =
             (byte)((uint)iVar13 >> 8) | (byte)(uVar17 >> 8) & output_data[uVar12 + 1];
        uVar6 = (ulong)((int)uVar6 + uVar7);
        uVar11 = uVar11 + 1;
      } while (character_count != uVar11);
    }
  }
  else {
    uVar11 = 0;
    if (4 < character_count) {
      uVar14 = character_count / 5;
      uVar17 = ~(-4 << (bVar3 & 0x1f));
      uVar5 = ~(-2 << (bVar3 & 0x1f));
      uVar11 = 0;
      do {
        bVar2 = integer_of_trits[input_data[uVar11 + 4] >> (bVar3 & 0x1f)]
                [input_data[uVar11 + 3] >> (bVar3 & 0x1f)][input_data[uVar11 + 2] >> (bVar3 & 0x1f)]
                [input_data[uVar11 + 1] >> (bVar3 & 0x1f)][input_data[uVar11] >> (bVar3 & 0x1f)];
        uVar9 = (uint)uVar6;
        bVar4 = (byte)uVar6 & 7;
        iVar13 = (((bVar2 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar11] & uVar18) & uVar17) <<
                 bVar4;
        uVar6 = (ulong)(uVar9 >> 3);
        uVar19 = ~(uVar17 << bVar4);
        output_data[uVar6] = (byte)iVar13 | output_data[uVar6] & (byte)uVar19;
        output_data[uVar6 + 1] =
             (byte)((uint)iVar13 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
        uVar8 = uVar9 + uVar7 + 2;
        bVar4 = (byte)uVar8 & 7;
        iVar13 = (((bVar2 >> 2 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar11 + 1] & uVar18) &
                 uVar17) << bVar4;
        uVar6 = (ulong)(uVar8 >> 3);
        uVar19 = ~(uVar17 << bVar4);
        output_data[uVar6] = (byte)iVar13 | output_data[uVar6] & (byte)uVar19;
        output_data[uVar6 + 1] =
             (byte)((uint)iVar13 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
        uVar19 = uVar7 * 2 + 4 + uVar9;
        bVar4 = (byte)uVar19 & 7;
        iVar13 = (((bVar2 >> 4 & 1) << (bVar3 & 0x1f) & 0xff | input_data[uVar11 + 2] & uVar18) &
                 uVar5) << bVar4;
        uVar6 = (ulong)(uVar19 >> 3);
        uVar19 = ~(uVar5 << bVar4);
        output_data[uVar6] = (byte)iVar13 | output_data[uVar6] & (byte)uVar19;
        output_data[uVar6 + 1] =
             (byte)((uint)iVar13 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
        uVar19 = uVar7 * 3 + 5 + uVar9;
        bVar4 = (byte)uVar19 & 7;
        iVar13 = (((bVar2 >> 5 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar11 + 3] & uVar18) &
                 uVar17) << bVar4;
        uVar6 = (ulong)(uVar19 >> 3);
        uVar19 = ~(uVar17 << bVar4);
        output_data[uVar6] = (byte)iVar13 | output_data[uVar6] & (byte)uVar19;
        output_data[uVar6 + 1] =
             (byte)((uint)iVar13 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
        uVar9 = uVar9 + uVar7 * 4 + 7;
        bVar4 = (byte)uVar9 & 7;
        iVar13 = (((uint)(bVar2 >> 7) << (bVar3 & 0x1f) & 0xff | input_data[uVar11 + 4] & uVar18) &
                 uVar5) << bVar4;
        uVar6 = (ulong)(uVar9 >> 3);
        uVar19 = ~(uVar5 << bVar4);
        output_data[uVar6] = (byte)iVar13 | output_data[uVar6] & (byte)uVar19;
        output_data[uVar6 + 1] =
             (byte)((uint)iVar13 >> 8) | (byte)(uVar19 >> 8) & output_data[uVar6 + 1];
        uVar6 = (ulong)(uVar8 + (uVar7 + 2) * 2 + (uVar7 + 1) * 2);
        uVar11 = uVar11 + 5;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    uVar17 = (uint)uVar11;
    if (character_count != uVar17) {
      if (uVar17 + 3 < character_count) {
        uVar12 = (ulong)(input_data[uVar17 + 3] >> (bVar3 & 0x1f));
      }
      else {
        uVar12 = 0;
      }
      if (uVar17 + 2 < character_count) {
        uVar15 = (ulong)(input_data[uVar17 + 2] >> (bVar3 & 0x1f));
      }
      else {
        uVar15 = 0;
      }
      if (uVar17 + 1 < character_count) {
        uVar20 = (ulong)(input_data[uVar17 + 1] >> (bVar3 & 0x1f));
      }
      else {
        uVar20 = 0;
      }
      if (uVar17 < character_count) {
        bVar2 = integer_of_trits[0][uVar12][uVar15][uVar20]
                [input_data[uVar11 & 0xffffffff] >> (bVar3 & 0x1f)];
        lVar16 = 0;
        do {
          iVar13 = "\x02\x02\x01\x02"[lVar16] + uVar7;
          uVar5 = ~(-1 << ((byte)iVar13 & 0x1f));
          bVar4 = (byte)uVar6 & 7;
          iVar10 = (((~(-1 << ("\x02\x02\x01\x02"[lVar16] & 0x1f)) &
                     (uint)(bVar2 >> (""[lVar16] & 0x1f))) << (bVar3 & 0x1f) & 0xff |
                    input_data[lVar16 + (uVar11 & 0xffffffff)] & uVar18) & uVar5) << bVar4;
          uVar12 = uVar6 >> 3;
          uVar5 = ~(uVar5 << bVar4);
          output_data[uVar12] = (byte)iVar10 | output_data[uVar12] & (byte)uVar5;
          output_data[uVar12 + 1] =
               (byte)((uint)iVar10 >> 8) | (byte)(uVar5 >> 8) & output_data[uVar12 + 1];
          uVar6 = (ulong)(uint)((int)uVar6 + iVar13);
          lVar16 = lVar16 + 1;
        } while (character_count - uVar17 != (int)lVar16);
      }
    }
  }
  return;
}

Assistant:

void encode_ise(
	quant_method quant_level,
	unsigned int character_count,
	const uint8_t* input_data,
	uint8_t* output_data,
	unsigned int bit_offset
) {
	promise(character_count > 0);

	unsigned int bits = btq_counts[quant_level].bits;
	unsigned int trits = btq_counts[quant_level].trits;
	unsigned int quints = btq_counts[quant_level].quints;
	unsigned int mask = (1 << bits) - 1;

	// Write out trits and bits
	if (trits)
	{
		unsigned int i = 0;
		unsigned int full_trit_blocks = character_count / 5;

		for (unsigned int j = 0; j < full_trit_blocks; j++)
		{
			unsigned int i4 = input_data[i + 4] >> bits;
			unsigned int i3 = input_data[i + 3] >> bits;
			unsigned int i2 = input_data[i + 2] >> bits;
			unsigned int i1 = input_data[i + 1] >> bits;
			unsigned int i0 = input_data[i + 0] >> bits;

			uint8_t T = integer_of_trits[i4][i3][i2][i1][i0];

			// The max size of a trit bit count is 6, so we can always safely
			// pack a single MX value with the following 1 or 2 T bits.
			uint8_t pack;

			// Element 0 + T0 + T1
			pack = (input_data[i++] & mask) | (((T >> 0) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 1 + T2 + T3
			pack = (input_data[i++] & mask) | (((T >> 2) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 2 + T4
			pack = (input_data[i++] & mask) | (((T >> 4) & 0x1) << bits);
			write_bits(pack, bits + 1, bit_offset, output_data);
			bit_offset += bits + 1;

			// Element 3 + T5 + T6
			pack = (input_data[i++] & mask) | (((T >> 5) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 4 + T7
			pack = (input_data[i++] & mask) | (((T >> 7) & 0x1) << bits);
			write_bits(pack, bits + 1, bit_offset, output_data);
			bit_offset += bits + 1;
		}

		// Loop tail for a partial block
		if (i != character_count)
		{
			// i4 cannot be present - we know the block is partial
			// i0 must be present - we know the block isn't empty
			unsigned int i4 =                            0;
			unsigned int i3 = i + 3 >= character_count ? 0 : input_data[i + 3] >> bits;
			unsigned int i2 = i + 2 >= character_count ? 0 : input_data[i + 2] >> bits;
			unsigned int i1 = i + 1 >= character_count ? 0 : input_data[i + 1] >> bits;
			unsigned int i0 =                                input_data[i + 0] >> bits;

			uint8_t T = integer_of_trits[i4][i3][i2][i1][i0];

			for (unsigned int j = 0; i < character_count; i++, j++)
			{
				// Truncated table as this iteration is always partital
				static const uint8_t tbits[4]  { 2, 2, 1, 2 };
				static const uint8_t tshift[4] { 0, 2, 4, 5 };

				uint8_t pack = (input_data[i] & mask) |
				               (((T >> tshift[j]) & ((1 << tbits[j]) - 1)) << bits);

				write_bits(pack, bits + tbits[j], bit_offset, output_data);
				bit_offset += bits + tbits[j];
			}
		}
	}
	// Write out quints and bits
	else if (quints)
	{
		unsigned int i = 0;
		unsigned int full_quint_blocks = character_count / 3;

		for (unsigned int j = 0; j < full_quint_blocks; j++)
		{
			unsigned int i2 = input_data[i + 2] >> bits;
			unsigned int i1 = input_data[i + 1] >> bits;
			unsigned int i0 = input_data[i + 0] >> bits;

			uint8_t T = integer_of_quints[i2][i1][i0];

			// The max size of a quint bit count is 5, so we can always safely
			// pack a single M value with the following 2 or 3 T bits.
			uint8_t pack;

			// Element 0
			pack = (input_data[i++] & mask) | (((T >> 0) & 0x7) << bits);
			write_bits(pack, bits + 3, bit_offset, output_data);
			bit_offset += bits + 3;

			// Element 1
			pack = (input_data[i++] & mask) | (((T >> 3) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 2
			pack = (input_data[i++] & mask) | (((T >> 5) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;
		}

		// Loop tail for a partial block
		if (i != character_count)
		{
			// i2 cannot be present - we know the block is partial
			// i0 must be present - we know the block isn't empty
			unsigned int i2 =                            0;
			unsigned int i1 = i + 1 >= character_count ? 0 : input_data[i + 1] >> bits;
			unsigned int i0 =                                input_data[i + 0] >> bits;

			uint8_t T = integer_of_quints[i2][i1][i0];

			for (unsigned int j = 0; i < character_count; i++, j++)
			{
				// Truncated table as this iteration is always partital
				static const uint8_t tbits[2]  { 3, 2 };
				static const uint8_t tshift[2] { 0, 3 };

				uint8_t pack = (input_data[i] & mask) |
				               (((T >> tshift[j]) & ((1 << tbits[j]) - 1)) << bits);

				write_bits(pack, bits + tbits[j], bit_offset, output_data);
				bit_offset += bits + tbits[j];
			}
		}
	}
	// Write out just bits
	else
	{
		for (unsigned int i = 0; i < character_count; i++)
		{
			write_bits(input_data[i], bits, bit_offset, output_data);
			bit_offset += bits;
		}
	}
}